

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGenerator.cpp
# Opt level: O1

Var Js::JavascriptGenerator::EntryReturn(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  JavascriptLibrary *this;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Var pvVar5;
  RecyclableObject *pRVar6;
  JavascriptGenerator *this_00;
  DynamicObject *pDVar7;
  Type TVar8;
  int in_stack_00000010;
  undefined1 local_80 [8];
  AutoTagNativeLibraryEntry __tag;
  undefined1 local_50 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptGenerator.cpp"
                                ,0x10f,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00bdd1b7;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_50 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_50,(CallInfo *)&args.super_Arguments.Values);
  __tag.entry.next =
       (Entry *)(((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr;
  this = (((ScriptContext *)__tag.entry.next)->super_ScriptContextBase).javascriptLibrary;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_80,function,(CallInfo)args.super_Arguments.Values,
             L"Generator.prototype.return",&stack0x00000000);
  pvVar5 = Arguments::operator[]((Arguments *)local_50,0);
  bVar2 = VarIs<Js::DynamicObject>(pvVar5);
  if (bVar2) {
    pvVar5 = Arguments::operator[]((Arguments *)local_50,0);
    if (pvVar5 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00bdd1b7;
      *puVar4 = 0;
    }
    if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00bdd1b7;
      *puVar4 = 0;
    }
    TVar8 = TypeIds_FirstNumberType;
    if ((((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) &&
       (TVar8 = TypeIds_Number, (ulong)pvVar5 >> 0x32 == 0)) {
      pRVar6 = UnsafeVarTo<Js::RecyclableObject>(pvVar5);
      if (pRVar6 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) goto LAB_00bdd1b7;
        *puVar4 = 0;
      }
      TVar8 = ((pRVar6->type).ptr)->typeId;
      if (0x57 < (int)TVar8) {
        BVar3 = RecyclableObject::IsExternal(pRVar6);
        if (BVar3 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
LAB_00bdd1b7:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar4 = 0;
        }
      }
    }
    if (TVar8 == TypeIds_Generator) {
      if (((ulong)local_50 & 0xfffffe) == 0) {
        pRVar6 = (this->super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      else {
        pRVar6 = (RecyclableObject *)Arguments::operator[]((Arguments *)local_50,1);
      }
      pvVar5 = Arguments::operator[]((Arguments *)local_50,0);
      this_00 = UnsafeVarTo<Js::JavascriptGenerator>(pvVar5);
      if (this_00->state == SuspendedStart) {
        SetCompleted(this_00);
      }
      if (this_00->state == Completed) {
        pDVar7 = JavascriptLibrary::CreateIteratorResultObject
                           (this,pRVar6,(this->super_JavascriptLibraryBase).booleanTrue.ptr);
      }
      else {
        if (this_00->state == Executing) {
          JavascriptError::ThrowTypeError
                    ((((((this_00->super_DynamicObject).super_RecyclableObject.type.ptr)->
                       javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
                     -0x7ff5ea0e,L"Generator.prototype.return");
        }
        pDVar7 = (DynamicObject *)CallGenerator(this_00,pRVar6,Return);
      }
      AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_80);
      return pDVar7;
    }
  }
  JavascriptError::ThrowTypeErrorVar
            ((ScriptContext *)__tag.entry.next,-0x7ff5ec04,L"Generator.prototype.return",
             L"Generator");
}

Assistant:

Var JavascriptGenerator::EntryReturn(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
    ARGUMENTS(args, callInfo);

    auto* scriptContext = function->GetScriptContext();
    auto* library = scriptContext->GetLibrary();

    AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Generator.prototype.return"));

    if (!VarIs<DynamicObject>(args[0]) || JavascriptOperators::GetTypeId(args[0]) != TypeIds_Generator)
    {
        JavascriptError::ThrowTypeErrorVar(
            scriptContext,
            JSERR_NeedObjectOfType,
            _u("Generator.prototype.return"),
            _u("Generator"));
    }

    Var input = args.Info.Count > 1 ? args[1] : library->GetUndefined();

    auto* generator = UnsafeVarTo<JavascriptGenerator>(args[0]);

    if (generator->IsSuspendedStart())
        generator->SetCompleted();

    if (generator->IsCompleted())
        return library->CreateIteratorResultObject(input, library->GetTrue());

    generator->ThrowIfExecuting(_u("Generator.prototype.return"));
    return generator->CallGenerator(input, ResumeYieldKind::Return);
}